

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_extension.cpp
# Opt level: O0

char * duckdb::EnumUtil::ToChars<duckdb_parquet::CompressionCodec::type>(type value)

{
  NotImplementedException *this;
  undefined4 in_EDI;
  string *in_stack_ffffffffffffff78;
  string *fmt_str;
  undefined1 local_51 [73];
  char *local_8;
  
  switch(in_EDI) {
  case 0:
    local_8 = "UNCOMPRESSED";
    break;
  case 1:
    local_8 = "SNAPPY";
    break;
  case 2:
    local_8 = "GZIP";
    break;
  case 3:
    local_8 = "LZO";
    break;
  case 4:
    local_8 = "BROTLI";
    break;
  case 5:
    local_8 = "LZ4";
    break;
  case 6:
    local_8 = "ZSTD";
    break;
  case 7:
    local_8 = "LZ4_RAW";
    break;
  default:
    this = (NotImplementedException *)__cxa_allocate_exception(0x10);
    fmt_str = (string *)local_51;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)(local_51 + 1),"Enum value: \'%s\' not implemented",(allocator *)fmt_str);
    StringUtil::Format<duckdb_parquet::CompressionCodec::type>(fmt_str,(type)((ulong)this >> 0x20));
    NotImplementedException::NotImplementedException(this,in_stack_ffffffffffffff78);
    __cxa_throw(this,&NotImplementedException::typeinfo,
                NotImplementedException::~NotImplementedException);
  }
  return local_8;
}

Assistant:

const char *EnumUtil::ToChars<duckdb_parquet::CompressionCodec::type>(duckdb_parquet::CompressionCodec::type value) {
	switch (value) {
	case CompressionCodec::UNCOMPRESSED:
		return "UNCOMPRESSED";
		break;
	case CompressionCodec::SNAPPY:
		return "SNAPPY";
		break;
	case CompressionCodec::GZIP:
		return "GZIP";
		break;
	case CompressionCodec::LZO:
		return "LZO";
		break;
	case CompressionCodec::BROTLI:
		return "BROTLI";
		break;
	case CompressionCodec::LZ4:
		return "LZ4";
		break;
	case CompressionCodec::LZ4_RAW:
		return "LZ4_RAW";
		break;
	case CompressionCodec::ZSTD:
		return "ZSTD";
		break;
	default:
		throw NotImplementedException(StringUtil::Format("Enum value: '%s' not implemented", value));
	}
}